

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<google::protobuf::Map<bool,proto2_unittest::Proto2MapEnum>,void>
               (Map<bool,_proto2_unittest::Proto2MapEnum> *container,ostream *os)

{
  NodeBase *pNVar1;
  long lVar2;
  const_iterator __begin0;
  
  std::operator<<(os,'{');
  google::protobuf::internal::UntypedMapBase::begin
            (&__begin0.super_UntypedMapIterator,(UntypedMapBase *)container);
  lVar2 = 0;
  do {
    pNVar1 = __begin0.super_UntypedMapIterator.node_;
    if (__begin0.super_UntypedMapIterator.node_ == (NodeBase *)0x0) {
      if (lVar2 != 0) {
LAB_0069d3dc:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_0069d3dc;
    }
    std::operator<<(os,' ');
    PrintTo<bool_const,proto2_unittest::Proto2MapEnum>
              ((pair<const_bool,_proto2_unittest::Proto2MapEnum> *)(pNVar1 + 1),os);
    lVar2 = lVar2 + 1;
    google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin0.super_UntypedMapIterator);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }